

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcBinaryStream.h
# Opt level: O0

void __thiscall
o3dgc::BinaryStream::WriteUInt32ASCII(BinaryStream *this,unsigned_long position,unsigned_long value)

{
  unsigned_long uVar1;
  byte *pbVar2;
  ulong local_30;
  unsigned_long i;
  unsigned_long value0;
  unsigned_long value_local;
  unsigned_long position_local;
  BinaryStream *this_local;
  
  uVar1 = Vector<unsigned_char>::GetSize(&this->m_stream);
  if (position < uVar1 - 5) {
    i = value;
    value_local = position;
    for (local_30 = 0; local_30 < 5; local_30 = local_30 + 1) {
      pbVar2 = Vector<unsigned_char>::operator[](&this->m_stream,value_local);
      *pbVar2 = (byte)i & 0x7f;
      i = i >> 7;
      value_local = value_local + 1;
    }
    return;
  }
  __assert_fail("position < m_stream.GetSize() - O3DGC_BINARY_STREAM_NUM_SYMBOLS_UINT32",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/contrib/Open3DGC/o3dgcBinaryStream.h"
                ,0x10f,"void o3dgc::BinaryStream::WriteUInt32ASCII(unsigned long, unsigned long)");
}

Assistant:

void                    WriteUInt32ASCII(unsigned long position, unsigned long value) 
                                {
                                    assert(position < m_stream.GetSize() - O3DGC_BINARY_STREAM_NUM_SYMBOLS_UINT32);
                                    unsigned long value0 = value;
                                    for(unsigned long i = 0; i < O3DGC_BINARY_STREAM_NUM_SYMBOLS_UINT32; ++i)
                                    {
                                        m_stream[position++] = (value0 & O3DGC_BINARY_STREAM_MAX_SYMBOL0);
                                        value0 >>= O3DGC_BINARY_STREAM_BITS_PER_SYMBOL0;
                                    }
                                }